

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign_fwd.h
# Opt level: O2

type dlib::
     matrix_assign_default<dlib::assignable_ptr_matrix<float>,dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>>
               (assignable_ptr_matrix<float> *dest,
               matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               *src,type alpha,bool add_to)

{
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  undefined7 in_register_00000011;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long r;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 in_register_00001204 [60];
  undefined1 auVar12 [64];
  
  auVar12._4_60_ = in_register_00001204;
  auVar12._0_4_ = alpha;
  if ((int)CONCAT71(in_register_00000011,add_to) == 0) {
    uVar5 = (src->data).nr_;
    uVar1 = (src->data).nc_;
    lVar7 = 0;
    uVar10 = 0;
    uVar8 = ~((long)uVar1 >> 0x3f) & uVar1;
    uVar5 = ~((long)uVar5 >> 0x3f) & uVar5;
    lVar6 = 0;
    if ((alpha != 1.0) || (NAN(alpha))) {
      for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
        lVar9 = dest->width;
        pfVar2 = (src->data).data;
        pfVar3 = dest->ptr;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pfVar3 + uVar11 * 4 + lVar9 * lVar7) =
               alpha * *(float *)((long)pfVar2 + uVar11 * 4 + lVar6);
        }
        lVar7 = lVar7 + 4;
        lVar6 = lVar6 + uVar1 * 4;
      }
    }
    else {
      for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
        lVar9 = dest->width;
        pfVar2 = (src->data).data;
        pfVar3 = dest->ptr;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          *(undefined4 *)((long)pfVar3 + uVar11 * 4 + lVar9 * lVar7) =
               *(undefined4 *)((long)pfVar2 + uVar11 * 4 + lVar6);
        }
        lVar7 = lVar7 + 4;
        lVar6 = lVar6 + uVar1 * 4;
      }
    }
  }
  else if ((alpha != 1.0) || (NAN(alpha))) {
    uVar5 = (src->data).nr_;
    uVar1 = (src->data).nc_;
    lVar7 = 0;
    uVar10 = 0;
    uVar8 = ~((long)uVar1 >> 0x3f) & uVar1;
    uVar5 = ~((long)uVar5 >> 0x3f) & uVar5;
    lVar6 = 0;
    if ((alpha != -1.0) || (NAN(alpha))) {
      for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
        pfVar2 = (src->data).data;
        lVar9 = dest->width * lVar7;
        pfVar3 = dest->ptr;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          auVar4 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pfVar2 + uVar11 * 4 + lVar6)),
                                   auVar12._0_16_,
                                   ZEXT416(*(uint *)((long)pfVar3 + uVar11 * 4 + lVar9)));
          *(int *)((long)pfVar3 + uVar11 * 4 + lVar9) = auVar4._0_4_;
        }
        lVar7 = lVar7 + 4;
        lVar6 = lVar6 + uVar1 * 4;
      }
    }
    else {
      for (; uVar10 != uVar5; uVar10 = uVar10 + 1) {
        pfVar2 = (src->data).data;
        lVar9 = dest->width * lVar7;
        pfVar3 = dest->ptr;
        for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)((long)pfVar3 + uVar11 * 4 + lVar9) =
               *(float *)((long)pfVar3 + uVar11 * 4 + lVar9) -
               *(float *)((long)pfVar2 + uVar11 * 4 + lVar6);
        }
        lVar7 = lVar7 + 4;
        lVar6 = lVar6 + uVar1 * 4;
      }
    }
  }
  else {
    uVar5 = (src->data).nr_;
    uVar1 = (src->data).nc_;
    lVar7 = 0;
    lVar6 = 0;
    for (uVar8 = 0; uVar8 != (~((long)uVar5 >> 0x3f) & uVar5); uVar8 = uVar8 + 1) {
      pfVar2 = (src->data).data;
      lVar9 = dest->width * lVar7;
      pfVar3 = dest->ptr;
      for (uVar10 = 0; (~((long)uVar1 >> 0x3f) & uVar1) != uVar10; uVar10 = uVar10 + 1) {
        *(float *)((long)pfVar3 + uVar10 * 4 + lVar9) =
             *(float *)((long)pfVar2 + uVar10 * 4 + lVar6) +
             *(float *)((long)pfVar3 + uVar10 * 4 + lVar9);
      }
      lVar7 = lVar7 + 4;
      lVar6 = lVar6 + uVar1 * 4;
    }
  }
  return;
}

Assistant:

inline typename disable_if<ma::has_column_major_layout<EXP1> >::type  
    matrix_assign_default (
        EXP1& dest,
        const EXP2& src,
        typename EXP2::type alpha,
        bool add_to
    )
    /*!
        requires
            - src.destructively_aliases(dest) == false
            - dest.nr() == src.nr()
            - dest.nc() == src.nc()
        ensures
            - if (add_to == false) then
                - #dest == alpha*src
            - else
                - #dest == dest + alpha*src
    !*/
    {
        if (add_to)
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += src(r,c);
                    }
                }
            }
            else if (alpha == static_cast<typename EXP2::type>(-1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) -= src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) += alpha*src(r,c);
                    }
                }
            }
        }
        else
        {
            if (alpha == static_cast<typename EXP2::type>(1))
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = src(r,c);
                    }
                }
            }
            else
            {
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        dest(r,c) = alpha*src(r,c);
                    }
                }
            }
        }
    }